

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool S2Loop::HasCrossingRelation(S2Loop *a,S2Loop *b,LoopRelation *relation)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  S2ClippedShape *a_clipped;
  S2ClippedShape *b_clipped;
  byte local_326;
  S2CellId local_320;
  S2CellId local_318;
  long local_310;
  int64 ab_relation;
  S2CellId local_300;
  uint64 local_2f8;
  S2CellId local_2f0;
  undefined1 local_2e8 [8];
  LoopCrosser ba;
  LoopCrosser ab;
  undefined1 local_c8 [8];
  RangeIterator_conflict bi;
  RangeIterator_conflict ai;
  LoopRelation *relation_local;
  S2Loop *b_local;
  S2Loop *a_local;
  
  RangeIterator::RangeIterator((RangeIterator *)&bi.range_max_,&a->index_);
  RangeIterator::RangeIterator((RangeIterator *)local_c8,&b->index_);
  LoopCrosser::LoopCrosser
            ((LoopCrosser *)
             &ba.b_cells_.
              super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,a,b,relation,false);
  LoopCrosser::LoopCrosser((LoopCrosser *)local_2e8,b,a,relation,true);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar1 = RangeIterator::Done((RangeIterator *)&bi.range_max_);
            local_326 = 1;
            if (bVar1) {
              bVar1 = RangeIterator::Done((RangeIterator *)local_c8);
              local_326 = bVar1 ^ 0xff;
            }
            if ((local_326 & 1) == 0) {
              a_local._7_1_ = false;
              goto LAB_004a29f9;
            }
            local_2f0 = RangeIterator::range_max((RangeIterator *)&bi.range_max_);
            local_2f8 = (uint64)RangeIterator::range_min((RangeIterator *)local_c8);
            bVar1 = ::operator<(local_2f0,(S2CellId)local_2f8);
            if (!bVar1) break;
            RangeIterator::SeekTo
                      ((RangeIterator *)&bi.range_max_,(RangeIterator_conflict *)local_c8);
          }
          local_300 = RangeIterator::range_max((RangeIterator *)local_c8);
          ab_relation = (int64)RangeIterator::range_min((RangeIterator *)&bi.range_max_);
          bVar1 = ::operator<(local_300,(S2CellId)ab_relation);
          if (!bVar1) break;
          RangeIterator::SeekTo((RangeIterator *)local_c8,(RangeIterator_conflict *)&bi.range_max_);
        }
        local_318 = RangeIterator::id((RangeIterator *)&bi.range_max_);
        uVar4 = S2CellId::lsb(&local_318);
        local_320 = RangeIterator::id((RangeIterator *)local_c8);
        uVar5 = S2CellId::lsb(&local_320);
        local_310 = uVar4 - uVar5;
        if (local_310 < 1) break;
        bVar1 = LoopCrosser::HasCrossingRelation
                          ((LoopCrosser *)
                           &ba.b_cells_.
                            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (RangeIterator_conflict *)&bi.range_max_,
                           (RangeIterator_conflict *)local_c8);
        if (bVar1) {
          a_local._7_1_ = true;
          goto LAB_004a29f9;
        }
      }
      if (local_310 < 0) break;
      bVar1 = RangeIterator::contains_center((RangeIterator *)&bi.range_max_);
      uVar2 = LoopCrosser::a_crossing_target
                        ((LoopCrosser *)
                         &ba.b_cells_.
                          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1 == uVar2) {
        bVar1 = RangeIterator::contains_center((RangeIterator *)local_c8);
        uVar2 = LoopCrosser::b_crossing_target
                          ((LoopCrosser *)
                           &ba.b_cells_.
                            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1 == uVar2) {
          a_local._7_1_ = true;
          goto LAB_004a29f9;
        }
      }
      iVar3 = RangeIterator::num_edges((RangeIterator *)&bi.range_max_);
      if ((0 < iVar3) && (iVar3 = RangeIterator::num_edges((RangeIterator *)local_c8), 0 < iVar3)) {
        a_clipped = RangeIterator::clipped((RangeIterator *)&bi.range_max_);
        b_clipped = RangeIterator::clipped((RangeIterator *)local_c8);
        bVar1 = LoopCrosser::CellCrossesCell
                          ((LoopCrosser *)
                           &ba.b_cells_.
                            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,a_clipped,b_clipped);
        if (bVar1) {
          a_local._7_1_ = true;
          goto LAB_004a29f9;
        }
      }
      RangeIterator::Next((RangeIterator *)&bi.range_max_);
      RangeIterator::Next((RangeIterator *)local_c8);
    }
    bVar1 = LoopCrosser::HasCrossingRelation
                      ((LoopCrosser *)local_2e8,(RangeIterator_conflict *)local_c8,
                       (RangeIterator_conflict *)&bi.range_max_);
  } while (!bVar1);
  a_local._7_1_ = true;
LAB_004a29f9:
  LoopCrosser::~LoopCrosser((LoopCrosser *)local_2e8);
  LoopCrosser::~LoopCrosser
            ((LoopCrosser *)
             &ba.b_cells_.
              super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  RangeIterator::~RangeIterator((RangeIterator *)local_c8);
  RangeIterator::~RangeIterator((RangeIterator *)&bi.range_max_);
  return a_local._7_1_;
}

Assistant:

bool S2Loop::HasCrossingRelation(const S2Loop& a, const S2Loop& b,
                                            LoopRelation* relation) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.
  RangeIterator ai(&a.index_), bi(&b.index_);
  LoopCrosser ab(a, b, relation, false);  // Tests edges of A against B
  LoopCrosser ba(b, a, relation, true);   // Tests edges of B against A
  while (!ai.Done() || !bi.Done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (ab.HasCrossingRelation(&ai, &bi)) return true;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (ba.HasCrossingRelation(&bi, &ai)) return true;
      } else {
        // The A and B cells are the same.  Since the two cells have the same
        // center point P, check whether P satisfies the crossing targets.
        if (ai.contains_center() == ab.a_crossing_target() &&
            bi.contains_center() == ab.b_crossing_target()) {
          return true;
        }
        // Otherwise test all the edge crossings directly.
        if (ai.num_edges() > 0 && bi.num_edges() > 0 &&
            ab.CellCrossesCell(ai.clipped(), bi.clipped())) {
          return true;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return false;
}